

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall kj::Own<kj::PromiseFulfiller<int>_>::dispose(Own<kj::PromiseFulfiller<int>_> *this)

{
  Dispose_<kj::PromiseFulfiller<int>,_true> *this_00;
  Disposer *in_RDX;
  
  this_00 = (Dispose_<kj::PromiseFulfiller<int>,_true> *)this->ptr;
  if (this_00 != (Dispose_<kj::PromiseFulfiller<int>,_true> *)0x0) {
    this->ptr = (PromiseFulfiller<int> *)0x0;
    Disposer::Dispose_<kj::PromiseFulfiller<int>,_true>::dispose
              (this_00,(PromiseFulfiller<int> *)this->disposer,in_RDX);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }